

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_client_sender(void *m_,intptr_t ignr_)

{
  fio_defer_task_s task;
  uint uVar1;
  fio_msg_internal_s *m;
  intptr_t ignr__local;
  void *m__local;
  
  if ((((cluster_data.uuid < 0) ||
       (uVar1 = (uint)((ulong)cluster_data.uuid >> 8), fio_data->capa <= uVar1)) ||
      ((cluster_data.uuid & 0xffU) !=
       (ulong)*(byte *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6d))) &&
     (fio_data->active != '\0')) {
    task.arg1 = m_;
    task.func = fio_cluster_client_sender;
    task.arg2 = (void *)ignr_;
    fio_defer_push_task_fn(task,&task_queue_normal);
    fio_defer_thread_signal();
  }
  else {
    fio_msg_internal_send_dup(cluster_data.uuid,(fio_msg_internal_s *)m_);
    fio_msg_internal_free((fio_msg_internal_s *)m_);
  }
  return;
}

Assistant:

static void fio_cluster_client_sender(void *m_, intptr_t ignr_) {
  fio_msg_internal_s *m = m_;
  if (!uuid_is_valid(cluster_data.uuid) && fio_data->active) {
    /* delay message delivery until we have a vaild uuid */
    fio_defer_push_task((void (*)(void *, void *))fio_cluster_client_sender, m_,
                        (void *)ignr_);
    return;
  }
  fio_msg_internal_send_dup(cluster_data.uuid, m);
  fio_msg_internal_free(m);
}